

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamFormatParser_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::SamFormatParser::ParseSamLine(SamFormatParser *this,string *line)

{
  __type _Var1;
  ulong uVar2;
  ulong in_RSI;
  string *in_RDI;
  string restOfLine;
  string firstToken;
  string *in_stack_000000d8;
  SamFormatParser *in_stack_000000e0;
  string *in_stack_000001b8;
  SamFormatParser *in_stack_000001c0;
  string *in_stack_00000228;
  SamFormatParser *in_stack_00000230;
  string *in_stack_00000278;
  SamFormatParser *in_stack_00000280;
  SamFormatParser *in_stack_ffffffffffffffa0;
  string local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  string local_30 [32];
  ulong local_10;
  
  local_10 = in_RSI;
  uVar2 = std::__cxx11::string::length();
  if (4 < uVar2) {
    std::__cxx11::string::substr((ulong)local_30,local_10);
    std::__cxx11::string::substr((ulong)local_50,local_10);
    _Var1 = std::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (_Var1) {
      ParseHDLine(in_stack_000000e0,in_stack_000000d8);
    }
    else {
      _Var1 = std::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      if (_Var1) {
        ParseSQLine(in_stack_00000230,in_stack_00000228);
      }
      else {
        _Var1 = std::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        if (_Var1) {
          ParseRGLine(in_stack_00000280,in_stack_00000278);
        }
        else {
          _Var1 = std::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
          if (_Var1) {
            ParsePGLine(in_stack_000001c0,in_stack_000001b8);
          }
          else {
            _Var1 = std::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
            if (_Var1) {
              ParseCOLine(in_stack_ffffffffffffffa0,in_RDI);
            }
          }
        }
      }
    }
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void SamFormatParser::ParseSamLine(const std::string& line)
{

    // skip if line is not long enough to contain true values
    if (line.length() < 5) {
        return;
    }

    // determine token at beginning of line
    const std::string firstToken = line.substr(0, 3);
    const std::string restOfLine = line.substr(4);
    if (firstToken == Constants::SAM_HD_BEGIN_TOKEN) {
        ParseHDLine(restOfLine);
    } else if (firstToken == Constants::SAM_SQ_BEGIN_TOKEN) {
        ParseSQLine(restOfLine);
    } else if (firstToken == Constants::SAM_RG_BEGIN_TOKEN) {
        ParseRGLine(restOfLine);
    } else if (firstToken == Constants::SAM_PG_BEGIN_TOKEN) {
        ParsePGLine(restOfLine);
    } else if (firstToken == Constants::SAM_CO_BEGIN_TOKEN) {
        ParseCOLine(restOfLine);
    }
}